

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mbedtls_mpi_read_binary(mbedtls_mpi *X,uchar *buf,size_t buflen)

{
  size_t limbs;
  int ret;
  size_t buflen_local;
  uchar *buf_local;
  mbedtls_mpi *X_local;
  
  limbs._4_4_ = mbedtls_mpi_resize_clear(X,(buflen >> 3) + (long)(int)(uint)((buflen & 7) != 0));
  if (limbs._4_4_ == 0) {
    limbs._4_4_ = mbedtls_mpi_core_read_be(X->p,(ulong)X->n,buf,buflen);
  }
  return limbs._4_4_;
}

Assistant:

int mbedtls_mpi_read_binary(mbedtls_mpi *X, const unsigned char *buf, size_t buflen)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    const size_t limbs = CHARS_TO_LIMBS(buflen);

    MPI_VALIDATE_RET(X != NULL);
    MPI_VALIDATE_RET(buflen == 0 || buf != NULL);

    /* Ensure that target MPI has exactly the necessary number of limbs */
    MBEDTLS_MPI_CHK(mbedtls_mpi_resize_clear(X, limbs));

    MBEDTLS_MPI_CHK(mbedtls_mpi_core_read_be(X->p, X->n, buf, buflen));

cleanup:

    /*
     * This function is also used to import keys. However, wiping the buffers
     * upon failure is not necessary because failure only can happen before any
     * input is copied.
     */
    return ret;
}